

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

uint ip4_scan(char *s,char *ip)

{
  uint uVar1;
  char local_30 [8];
  unsigned_long u;
  uint len;
  uint i;
  char *ip_local;
  char *s_local;
  
  u._0_4_ = 0;
  _len = ip;
  ip_local = s;
  u._4_4_ = scan_ulong(s,(unsigned_long *)local_30);
  if (u._4_4_ == 0) {
    s_local._4_4_ = 0;
  }
  else {
    *_len = local_30[0];
    if (ip_local[u._4_4_] == '.') {
      ip_local = ip_local + u._4_4_ + 1;
      u._0_4_ = u._4_4_ + (int)u + 1;
      u._4_4_ = scan_ulong(ip_local,(unsigned_long *)local_30);
      if (u._4_4_ == 0) {
        s_local._4_4_ = 0;
      }
      else {
        _len[1] = local_30[0];
        if (ip_local[u._4_4_] == '.') {
          ip_local = ip_local + u._4_4_ + 1;
          u._0_4_ = u._4_4_ + (int)u + 1;
          u._4_4_ = scan_ulong(ip_local,(unsigned_long *)local_30);
          if (u._4_4_ == 0) {
            s_local._4_4_ = 0;
          }
          else {
            _len[2] = local_30[0];
            if (ip_local[u._4_4_] == '.') {
              ip_local = ip_local + u._4_4_ + 1;
              u._0_4_ = u._4_4_ + (int)u + 1;
              uVar1 = scan_ulong(ip_local,(unsigned_long *)local_30);
              if (uVar1 == 0) {
                s_local._4_4_ = 0;
              }
              else {
                _len[3] = local_30[0];
                s_local._4_4_ = uVar1 + (int)u;
              }
            }
            else {
              s_local._4_4_ = 0;
            }
          }
        }
        else {
          s_local._4_4_ = 0;
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

unsigned int ip4_scan(const char *s,char ip[4])
{
  unsigned int i;
  unsigned int len;
  unsigned long u;

  len = 0;
  i = scan_ulong(s,&u); if (!i) return 0; ip[0] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[1] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[2] = u; s += i; len += i;
  if (*s != '.') return 0; ++s; ++len;
  i = scan_ulong(s,&u); if (!i) return 0; ip[3] = u; s += i; len += i;
  return len;
}